

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen.c
# Opt level: O2

void zxscreen_convert(void *vscr,uint *poutput,zxbox_t *dirty)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint *puVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  
  uVar3 = dirty->x0;
  uVar9 = uVar3 >> 5;
  if ((int)uVar3 < 1) {
    uVar9 = 0;
  }
  uVar6 = 7;
  if ((int)uVar3 < 0xff) {
    uVar6 = uVar9;
  }
  uVar3 = dirty->y0;
  if (dirty->y0 < 1) {
    uVar3 = 0;
  }
  if (0xbe < (int)uVar3) {
    uVar3 = 0xbf;
  }
  iVar5 = dirty->x1;
  uVar9 = 8;
  if (iVar5 < 0x100) {
    uVar9 = 1;
  }
  uVar4 = iVar5 + 0x1fU >> 5;
  if (iVar5 - 0x100U < 0xffffff02) {
    uVar4 = uVar9;
  }
  uVar9 = 1;
  if (1 < dirty->y1) {
    uVar9 = dirty->y1;
  }
  uVar10 = (ulong)(0xc0 - uVar9);
  if (0xc0 < uVar9) {
    uVar10 = 0;
  }
  lVar11 = (long)vscr + (ulong)(((uint)uVar10 & 0xf8) + uVar6) * 4 + 0x1800;
  puVar8 = poutput + (uVar6 * 0x20 + (uint)uVar10 * 0x100);
  iVar5 = uVar4 - uVar6;
  while (uVar9 = (uint)uVar10, uVar9 < 0xc0 - uVar3) {
    lVar12 = 0;
    for (iVar7 = iVar5; 0 < iVar7; iVar7 = iVar7 + -1) {
      uVar4 = *(uint *)((long)vscr +
                       lVar12 + (ulong)(uVar6 + (((((uint)(uVar10 >> 3) ^ uVar9) & 7) * 9 ^ uVar9) &
                                                0x7ffffff) * 8) * 4);
      uVar2 = *(uint *)(lVar11 + lVar12);
      bVar1 = ""[uVar2 & 0x7f];
      *puVar8 = *(uint *)((long)palette + (ulong)(uVar4 >> 5 & 4) + (ulong)bVar1 * 4);
      puVar8[1] = *(uint *)((long)palette + (ulong)(uVar4 >> 4 & 4) + (ulong)bVar1 * 4);
      puVar8[2] = *(uint *)((long)palette + (ulong)(uVar4 >> 3 & 4) + (ulong)bVar1 * 4);
      puVar8[3] = *(uint *)((long)palette + (ulong)(uVar4 >> 2 & 4) + (ulong)bVar1 * 4);
      puVar8[4] = *(uint *)((long)palette + (ulong)(uVar4 >> 1 & 4) + (ulong)bVar1 * 4);
      puVar8[5] = *(uint *)((long)palette + (ulong)(uVar4 & 4) + (ulong)bVar1 * 4);
      puVar8[6] = *(uint *)((long)palette + (ulong)(uVar4 & 2) * 2 + (ulong)bVar1 * 4);
      puVar8[7] = palette[(ulong)bVar1 + (ulong)(uVar4 & 1)];
      bVar1 = ""[uVar2 >> 8 & 0x7f];
      puVar8[8] = *(uint *)((long)palette + (ulong)(uVar4 >> 0xd & 4) + (ulong)bVar1 * 4);
      puVar8[9] = *(uint *)((long)palette + (ulong)(uVar4 >> 0xc & 4) + (ulong)bVar1 * 4);
      puVar8[10] = *(uint *)((long)palette + (ulong)(uVar4 >> 0xb & 4) + (ulong)bVar1 * 4);
      puVar8[0xb] = *(uint *)((long)palette + (ulong)(uVar4 >> 10 & 4) + (ulong)bVar1 * 4);
      puVar8[0xc] = *(uint *)((long)palette + (ulong)(uVar4 >> 9 & 4) + (ulong)bVar1 * 4);
      puVar8[0xd] = *(uint *)((long)palette + (ulong)(uVar4 >> 8 & 4) + (ulong)bVar1 * 4);
      puVar8[0xe] = *(uint *)((long)palette + (ulong)(uVar4 >> 7 & 4) + (ulong)bVar1 * 4);
      puVar8[0xf] = *(uint *)((long)palette + (ulong)(uVar4 >> 6 & 4) + (ulong)bVar1 * 4);
      bVar1 = ""[uVar2 >> 0x10 & 0x7f];
      puVar8[0x10] = *(uint *)((long)palette + (ulong)(uVar4 >> 0x15 & 4) + (ulong)bVar1 * 4);
      puVar8[0x11] = *(uint *)((long)palette + (ulong)(uVar4 >> 0x14 & 4) + (ulong)bVar1 * 4);
      puVar8[0x12] = *(uint *)((long)palette + (ulong)(uVar4 >> 0x13 & 4) + (ulong)bVar1 * 4);
      puVar8[0x13] = *(uint *)((long)palette + (ulong)(uVar4 >> 0x12 & 4) + (ulong)bVar1 * 4);
      puVar8[0x14] = *(uint *)((long)palette + (ulong)(uVar4 >> 0x11 & 4) + (ulong)bVar1 * 4);
      puVar8[0x15] = *(uint *)((long)palette + (ulong)(uVar4 >> 0x10 & 4) + (ulong)bVar1 * 4);
      puVar8[0x16] = *(uint *)((long)palette + (ulong)(uVar4 >> 0xf & 4) + (ulong)bVar1 * 4);
      puVar8[0x17] = *(uint *)((long)palette + (ulong)(uVar4 >> 0xe & 4) + (ulong)bVar1 * 4);
      bVar1 = ""[uVar2 >> 0x18 & 0x7f];
      puVar8[0x18] = palette[(ulong)bVar1 + (ulong)(uVar4 >> 0x1f)];
      puVar8[0x19] = *(uint *)((long)palette + (ulong)(uVar4 >> 0x1c & 4) + (ulong)bVar1 * 4);
      puVar8[0x1a] = *(uint *)((long)palette + (ulong)(uVar4 >> 0x1b & 4) + (ulong)bVar1 * 4);
      puVar8[0x1b] = *(uint *)((long)palette + (ulong)(uVar4 >> 0x1a & 4) + (ulong)bVar1 * 4);
      puVar8[0x1c] = *(uint *)((long)palette + (ulong)(uVar4 >> 0x19 & 4) + (ulong)bVar1 * 4);
      puVar8[0x1d] = *(uint *)((long)palette + (ulong)(uVar4 >> 0x18 & 4) + (ulong)bVar1 * 4);
      puVar8[0x1e] = *(uint *)((long)palette + (ulong)(uVar4 >> 0x17 & 4) + (ulong)bVar1 * 4);
      puVar8[0x1f] = *(uint *)((long)palette + (ulong)(uVar4 >> 0x16 & 4) + (ulong)bVar1 * 4);
      puVar8 = puVar8 + 0x20;
      lVar12 = lVar12 + 4;
    }
    puVar8 = puVar8 + (0x100 - (long)(iVar5 * 0x20));
    lVar11 = lVar11 + (long)iVar5 * -4 + (ulong)((~uVar9 & 7) == 0) * 0x20 + lVar12;
    uVar10 = (ulong)(uVar9 + 1);
  }
  return;
}

Assistant:

void zxscreen_convert(const void    *vscr,
                      unsigned int  *poutput,
                      const zxbox_t *dirty)
{
  zxbox_t              box;
  int                  height;
  const unsigned int  *pattrs;
  int                  width;
  int                  x,linear_y;
  const unsigned int  *pinput;
  unsigned int         input;
  unsigned int         attrs;
  const unsigned int  *pal;

  assert(dirty);

#ifdef SHOW_DIRTY_RECTS
  static int dirtybits;
  dirtybits = 0x20202020 - dirtybits;
#endif

  /* Clamp the dirty rectangle to the screen dimensions. */
  box.x0 = CLAMP(dirty->x0, 0, 255);
  box.y0 = CLAMP(dirty->y0, 0, 191);
  box.x1 = CLAMP(dirty->x1, 1, 256);
  box.y1 = CLAMP(dirty->y1, 1, 192);

  /* The inner loop processes 32 pixels at a time, so we need to convert x
   * coordinates into chunks four attributes wide while rounding up and down as
   * required. */
  box.x0 = (box.x0     ) / 32; /* divide to 0..7 rounding down */
  box.x1 = (box.x1 + 31) / 32; /* divide to 0..7 rounding up */

  /* Convert y coordinates into screen space - (0,0) is top left. */
  height = box.y1 - box.y0;
  box.y0 = 192 - box.y1;
  box.y1 = box.y0 + height;

  pattrs = (const unsigned int *) vscr
         + (SCREEN_BITMAP_LENGTH
         + box.y0 / 8 * 32  /* 8 scanlines/row, 32 attrs/row */
         + box.x0 * 4) / 4; /* 4 bytes/chunk, 4 bytes/word */

  poutput += box.y0 * 256 /* 256 pixels/row (256 words) for output */
           + box.x0 * 32; /* 32 pixels/chunk (32 words) */

  width = box.x1 - box.x0; /* hoisted out of loop */

  for (linear_y = box.y0; linear_y < box.y1; linear_y++)
  {
    /* Transpose fields using XOR */
    unsigned int tmp = (linear_y ^ (linear_y >> 3)) & 7;
    int          y   = linear_y ^ (tmp | (tmp << 3));

    pinput = (const unsigned int *) vscr
           + (y     * 32           /* 32 bytes/row */
           + box.x0 * 32 / 8) / 4; /* 32 bytes/row, 8 pixels/byte, 4 bytes/word */
    for (x = width; x > 0; x--) /* x is unused in the loop body */
    {
      input = *pinput++;
      attrs = *pattrs++;
#ifdef SHOW_DIRTY_RECTS
      attrs ^= dirtybits; /* force colour attrs to show redrawn areas */
#endif

      WRITE8PIX(0);
      WRITE8PIX(8);
      WRITE8PIX(16);
      WRITE8PIX(24);
    }

    /* Skip to the start of the next row. */
    pattrs  += 8   - width;
    poutput += 256 - width * 32;

    /* Rewind pattrs except at the end of an attribute row. */
    if ((linear_y & 7) != 7)
      pattrs -= 8;
  }
}